

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldClear
          (MessageGenerator *this,FieldDescriptor *field,bool is_inline,Printer *p)

{
  Printer *pPVar1;
  long *plVar2;
  long lVar3;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  t;
  long alStack_258 [4];
  undefined1 auStack_238 [40];
  long *local_210 [2];
  long local_200 [2];
  Printer *local_1f0;
  undefined1 local_1e8 [32];
  FieldDescriptor *local_1c8;
  char *local_1c0;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_1b8;
  Sub local_1a0;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  long *local_c8;
  undefined8 local_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  auStack_238._24_8_ = 0xda28c4;
  local_1f0 = p;
  local_1c8 = field;
  MakeTrackerCalls((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                    *)&local_1a0,field,&this->options_);
  vars.len_ = ((long)(local_1a0.key_._M_string_length - (long)local_1a0.key_._M_dataplus._M_p) >> 3)
              * -0x2c8590b21642c859;
  auStack_238._24_8_ = 0xda28f2;
  vars.ptr_ = (pointer)local_1a0.key_._M_dataplus._M_p;
  io::Printer::WithDefs(&local_1b8,p,vars,false);
  auStack_238._24_8_ = 0xda28fc;
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)&local_1a0);
  pPVar1 = local_1f0;
  local_1e8._0_8_ = local_1e8 + 0x10;
  auStack_238._24_8_ = 0xda2925;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"inline","");
  local_1c0 = anon_var_dwarf_a22956 + 5;
  if (is_inline) {
    local_1c0 = "inline";
  }
  auStack_238._24_8_ = 0xda294c;
  io::Printer::Sub::Sub<char_const*>(&local_1a0,(string *)local_1e8,&local_1c0);
  auStack_238._24_8_ = 0xda2975;
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"body","");
  local_e8 = &local_d8;
  if (local_210[0] == local_200) {
    uStack_d0 = local_200[1];
  }
  else {
    local_e8 = local_210[0];
  }
  local_e0 = local_210[1];
  local_210[1] = (long *)0x0;
  local_200[0]._0_1_ = 0;
  auStack_238._24_8_ = 0xda29d8;
  local_210[0] = local_200;
  local_c8 = (long *)operator_new(0x20);
  *local_c8 = (long)&local_1c8;
  local_c8[1] = (long)&local_1f0;
  local_c8[2] = (long)this;
  *(undefined1 *)(local_c8 + 3) = 0;
  local_b0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_invoke;
  local_c0 = 0;
  local_b8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
  local_a8 = 1;
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  auStack_238._24_8_ = 0xda2a56;
  std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x120d342);
  local_38 = 0;
  auStack_238._24_8_ = 0xda2a7b;
  io::Printer::Emit(pPVar1,&local_1a0,2,0xd7,
                    "\n            $inline $void $classname$::clear_$name$() {\n              $pbi$::TSanWrite(&_impl_);\n              $WeakDescriptorSelfPin$;\n              $body$;\n              $annotate_clear$;\n            }\n          "
                   );
  lVar3 = 0x170;
  do {
    if (local_1b8.storage_.callback_buffer_[lVar3 + 8] == '\x01') {
      auStack_238._24_8_ = 0xda2aa2;
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_1e8 + lVar3));
    }
    if ((long *)((long)local_200 + lVar3) != *(long **)((long)local_210 + lVar3)) {
      auStack_238._24_8_ = 0xda2abe;
      operator_delete(*(long **)((long)local_210 + lVar3),*(long *)((long)local_200 + lVar3) + 1);
    }
    auStack_238._24_8_ = 0xda2ad1;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[(byte)auStack_238[lVar3 + 0x20]]._M_data)
              ((anon_class_1_0_00000001 *)(auStack_238 + 0x27),
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(auStack_238 + lVar3));
    plVar2 = (long *)((long)alStack_258 + lVar3 + 0x10);
    auStack_238[lVar3 + 0x20] = 0xff;
    if (plVar2 != *(long **)((long)alStack_258 + lVar3)) {
      auStack_238._24_8_ = 0xda2af1;
      operator_delete(*(long **)((long)alStack_258 + lVar3),*plVar2 + 1);
    }
    lVar3 = lVar3 + -0xb8;
  } while (lVar3 != 0);
  if (local_210[0] != local_200) {
    auStack_238._24_8_ = 0xda2b11;
    operator_delete(local_210[0],CONCAT71(local_200[0]._1_7_,(undefined1)local_200[0]) + 1);
  }
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    auStack_238._24_8_ = 0xda2b2d;
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  auStack_238._24_8_ = 0xda2b37;
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&local_1b8);
  return;
}

Assistant:

void MessageGenerator::GenerateFieldClear(const FieldDescriptor* field,
                                          bool is_inline, io::Printer* p) {
  auto t = p->WithVars(MakeTrackerCalls(field, options_));
  p->Emit({{"inline", is_inline ? "inline" : ""},
           {"body",
            [&] {
              if (field->real_containing_oneof()) {
                // Clear this field only if it is the active field in this
                // oneof, otherwise ignore
                p->Emit(
                    {{"clearing_code",
                      [&] {
                        field_generators_.get(field).GenerateClearingCode(p);
                      }}},
                    R"cc(
                      if ($has_field$) {
                        $clearing_code$;
                        clear_has_$oneof_name$();
                      }
                    )cc");
              } else {
                // TODO: figure out if early return breaks tracking
                if (ShouldSplit(field, options_)) {
                  p->Emit(R"cc(
                    if (ABSL_PREDICT_TRUE(IsSplitMessageDefault()))
                      return;
                  )cc");
                }
                field_generators_.get(field).GenerateClearingCode(p);
                if (HasHasbit(field)) {
                  auto v = p->WithVars(HasBitVars(field));
                  p->Emit(R"cc(
                    $has_bits$[$has_array_index$] &= ~$has_mask$;
                  )cc");
                }
              }
            }}},
          R"cc(
            $inline $void $classname$::clear_$name$() {
              $pbi$::TSanWrite(&_impl_);
              $WeakDescriptorSelfPin$;
              $body$;
              $annotate_clear$;
            }
          )cc");
}